

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpAggregator.cpp
# Opt level: O3

void __thiscall
HighsLpAggregator::HighsLpAggregator(HighsLpAggregator *this,HighsLpRelaxation *lprelaxation)

{
  size_type __new_size;
  
  this->lprelaxation = lprelaxation;
  (this->vectorsum).values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vectorsum).values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vectorsum).values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __new_size = (long)(lprelaxation->lpsolver).model_.lp_.num_col_ +
               (long)(lprelaxation->lpsolver).model_.lp_.num_row_;
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
            (&(this->vectorsum).values,__new_size);
  std::vector<int,_std::allocator<int>_>::reserve(&(this->vectorsum).nonzeroinds,__new_size);
  return;
}

Assistant:

HighsLpAggregator::HighsLpAggregator(const HighsLpRelaxation& lprelaxation)
    : lprelaxation(lprelaxation) {
  vectorsum.setDimension(lprelaxation.getLp().num_row_ +
                         lprelaxation.getLp().num_col_);
}